

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O0

int add_line(backtrace_state *state,dwarf_data *ddata,uintptr_t pc,char *filename,int lineno,
            backtrace_error_callback error_callback,void *data,line_vector *vec)

{
  uintptr_t *puVar1;
  long *plVar2;
  line *ln;
  backtrace_error_callback error_callback_local;
  int lineno_local;
  char *filename_local;
  uintptr_t pc_local;
  dwarf_data *ddata_local;
  backtrace_state *state_local;
  
  if ((((vec->count == 0) ||
       (puVar1 = (uintptr_t *)((long)(vec->vec).base + (vec->count - 1) * 0x18), pc != *puVar1)) ||
      (filename != (char *)puVar1[1])) || (lineno != (int)puVar1[2])) {
    plVar2 = (long *)tcmalloc_backtrace_vector_grow(state,0x18,error_callback,data,&vec->vec);
    if (plVar2 == (long *)0x0) {
      state_local._4_4_ = 0;
    }
    else {
      *plVar2 = pc + (ddata->base_address).m;
      plVar2[1] = (long)filename;
      *(int *)(plVar2 + 2) = lineno;
      *(int *)((long)plVar2 + 0x14) = (int)vec->count;
      vec->count = vec->count + 1;
      state_local._4_4_ = 1;
    }
  }
  else {
    state_local._4_4_ = 1;
  }
  return state_local._4_4_;
}

Assistant:

static int
add_line (struct backtrace_state *state, struct dwarf_data *ddata,
	  uintptr_t pc, const char *filename, int lineno,
	  backtrace_error_callback error_callback, void *data,
	  struct line_vector *vec)
{
  struct line *ln;

  /* If we are adding the same mapping, ignore it.  This can happen
     when using discriminators.  */
  if (vec->count > 0)
    {
      ln = (struct line *) vec->vec.base + (vec->count - 1);
      if (pc == ln->pc && filename == ln->filename && lineno == ln->lineno)
	return 1;
    }

  ln = ((struct line *)
	backtrace_vector_grow (state, sizeof (struct line), error_callback,
			       data, &vec->vec));
  if (ln == NULL)
    return 0;

  /* Add in the base address here, so that we can look up the PC
     directly.  */
  ln->pc = libbacktrace_add_base (pc, ddata->base_address);

  ln->filename = filename;
  ln->lineno = lineno;
  ln->idx = vec->count;

  ++vec->count;

  return 1;
}